

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextVkImpl::EndQuery(DeviceContextVkImpl *this,IQuery *pQuery)

{
  QUERY_TYPE Type;
  undefined *puVar1;
  bool bVar2;
  Uint32 query;
  Char *pCVar3;
  QueryVkImpl *this_00;
  QueryDesc *pQVar4;
  VkQueryPool queryPool;
  StateCache *pSVar5;
  undefined8 uVar6;
  byte bVar7;
  undefined1 local_110 [8];
  string _msg;
  string msg_4;
  StateCache *CmdBuffState;
  string msg_3;
  string msg_2;
  Uint32 Idx;
  VkQueryPool vkQueryPool;
  QUERY_TYPE QueryType;
  QueryVkImpl *pQueryVkImpl;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  IQuery *pQuery_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = pQuery;
  DeviceContextBase<Diligent::EngineVkImplTraits>::EndQuery
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pQuery,0);
  if ((this->m_pQueryMgr == (QueryManagerVk *)0x0) &&
     (bVar2 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                        ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this), !bVar2)) {
    FormatString<char[80]>
              ((string *)local_38,
               (char (*) [80])
               "Query manager should never be null for immediate contexts. This might be a bug.");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb77);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (this->m_pQueryMgr == (QueryManagerVk *)0x0) {
    FormatString<char[94]>
              ((string *)&pQueryVkImpl,
               (char (*) [94])
               "Query manager is null, which indicates that this deferred context is not in a recording state"
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb78);
    std::__cxx11::string::~string((string *)&pQueryVkImpl);
  }
  this_00 = ClassPtrCast<Diligent::QueryVkImpl,Diligent::IQuery>((IQuery *)msg.field_2._8_8_);
  pQVar4 = DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>::
           GetDesc((DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                    *)this_00);
  Type = pQVar4->Type;
  queryPool = QueryManagerVk::GetQueryPool(this->m_pQueryMgr,Type);
  query = QueryVkImpl::GetQueryPoolIndex(this_00,(uint)(Type == QUERY_TYPE_DURATION));
  if (queryPool == (VkQueryPool)0x0) {
    FormatString<char[45]>
              ((string *)((long)&msg_3.field_2 + 8),
               (char (*) [45])"Query pool is not initialized for query type");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb7f);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  EnsureVkCmdBuffer(this);
  if ((Type == QUERY_TYPE_TIMESTAMP) || (Type == QUERY_TYPE_DURATION)) {
    VulkanUtilities::VulkanCommandBuffer::WriteTimestamp
              (&this->m_CommandBuffer,VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT,queryPool,query);
  }
  else {
    if (this->m_ActiveQueriesCounter < 1) {
      FormatString<char[99]>
                ((string *)&CmdBuffState,
                 (char (*) [99])
                 "Active query counter is 0 which means there was a mismatch between BeginQuery() / EndQuery() calls"
                );
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xb88);
      std::__cxx11::string::~string((string *)&CmdBuffState);
    }
    pSVar5 = VulkanUtilities::VulkanCommandBuffer::GetState(&this->m_CommandBuffer);
    bVar7 = (byte)Type;
    if (((pSVar5->InsidePassQueries | pSVar5->OutsidePassQueries) & 1 << (bVar7 & 0x1f)) == 0) {
      FormatString<char[124]>
                ((string *)((long)&_msg.field_2 + 8),
                 (char (*) [124])
                 "No query flag is set which indicates there was no matching BeginQuery call or there was an error while beginning the query."
                );
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xb8e);
      std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
    }
    if ((pSVar5->OutsidePassQueries & 1 << (bVar7 & 0x1f)) == 0) {
      pSVar5 = VulkanUtilities::VulkanCommandBuffer::GetState(&this->m_CommandBuffer);
      if (pSVar5->RenderPass == (VkRenderPass)0x0) {
        FormatString<char[297]>
                  ((string *)local_110,
                   (char (*) [297])
                   "The query was started inside render pass, but is being ended outside of render pass. Vulkan requires that a query must either begin and end inside the same subpass of a render pass instance, or must both begin and end outside of a render pass instance (i.e. contain entire render pass instances)."
                  );
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar6 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(2,uVar6,0);
        }
        std::__cxx11::string::~string((string *)local_110);
      }
    }
    else {
      EndRenderScope(this);
    }
    this->m_ActiveQueriesCounter = this->m_ActiveQueriesCounter + -1;
    VulkanUtilities::VulkanCommandBuffer::EndQuery
              (&this->m_CommandBuffer,queryPool,query,1 << (bVar7 & 0x1f));
  }
  return;
}

Assistant:

void DeviceContextVkImpl::EndQuery(IQuery* pQuery)
{
    TDeviceContextBase::EndQuery(pQuery, 0);

    VERIFY(m_pQueryMgr != nullptr || IsDeferred(), "Query manager should never be null for immediate contexts. This might be a bug.");
    DEV_CHECK_ERR(m_pQueryMgr != nullptr, "Query manager is null, which indicates that this deferred context is not in a recording state");

    QueryVkImpl*     pQueryVkImpl = ClassPtrCast<QueryVkImpl>(pQuery);
    const QUERY_TYPE QueryType    = pQueryVkImpl->GetDesc().Type;
    VkQueryPool      vkQueryPool  = m_pQueryMgr->GetQueryPool(QueryType);
    Uint32           Idx          = pQueryVkImpl->GetQueryPoolIndex(QueryType == QUERY_TYPE_DURATION ? 1 : 0);

    VERIFY(vkQueryPool != VK_NULL_HANDLE, "Query pool is not initialized for query type");

    EnsureVkCmdBuffer();
    if (QueryType == QUERY_TYPE_TIMESTAMP || QueryType == QUERY_TYPE_DURATION)
    {
        m_CommandBuffer.WriteTimestamp(VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, vkQueryPool, Idx);
    }
    else
    {
        VERIFY(m_ActiveQueriesCounter > 0, "Active query counter is 0 which means there was a mismatch between BeginQuery() / EndQuery() calls");

        // A query must either begin and end inside the same subpass of a render pass instance, or must
        // both begin and end outside of a render pass instance (i.e. contain entire render pass instances).
        const VulkanUtilities::VulkanCommandBuffer::StateCache& CmdBuffState = m_CommandBuffer.GetState();
        VERIFY((CmdBuffState.InsidePassQueries | CmdBuffState.OutsidePassQueries) & (1u << QueryType),
               "No query flag is set which indicates there was no matching BeginQuery call or there was an error while beginning the query.");
        if (CmdBuffState.OutsidePassQueries & (1 << QueryType))
        {
            EndRenderScope();
        }
        else
        {
            if (!m_CommandBuffer.GetState().RenderPass)
                LOG_ERROR_MESSAGE("The query was started inside render pass, but is being ended outside of render pass. "
                                  "Vulkan requires that a query must either begin and end inside the same "
                                  "subpass of a render pass instance, or must both begin and end outside of a render pass "
                                  "instance (i.e. contain entire render pass instances).");
        }

        --m_ActiveQueriesCounter;
        m_CommandBuffer.EndQuery(vkQueryPool, Idx, 1u << QueryType);
    }
}